

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialect_detection.cpp
# Opt level: O3

vector<duckdb::vector<char,_true>,_true> * duckdb::DialectCandidates::GetDefaultQuote(void)

{
  void *pvVar1;
  vector<duckdb::vector<char,_true>,_std::allocator<duckdb::vector<char,_true>_>_> *in_RDI;
  long lVar2;
  initializer_list<char> __l;
  initializer_list<char> __l_00;
  initializer_list<char> __l_01;
  initializer_list<duckdb::vector<char,_true>_> __l_02;
  allocator_type aStack_68;
  allocator_type local_67;
  char local_66;
  allocator_type local_65;
  allocator_type local_64;
  char local_63;
  char local_62 [2];
  vector<char,_std::allocator<char>_> local_60;
  vector<char,_std::allocator<char>_> local_48;
  vector<char,_std::allocator<char>_> local_30;
  
  local_63 = '\0';
  __l._M_len = 1;
  __l._M_array = &local_63;
  ::std::vector<char,_std::allocator<char>_>::vector(&local_60,__l,&local_64);
  local_62[0] = '\"';
  local_62[1] = '\'';
  __l_00._M_len = 2;
  __l_00._M_array = local_62;
  ::std::vector<char,_std::allocator<char>_>::vector(&local_48,__l_00,&local_65);
  local_66 = '\"';
  __l_01._M_len = 1;
  __l_01._M_array = &local_66;
  ::std::vector<char,_std::allocator<char>_>::vector(&local_30,__l_01,&local_67);
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&local_60;
  ::std::vector<duckdb::vector<char,_true>,_std::allocator<duckdb::vector<char,_true>_>_>::vector
            (in_RDI,__l_02,&aStack_68);
  lVar2 = 0x30;
  do {
    pvVar1 = *(void **)((long)&local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar2);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  return (vector<duckdb::vector<char,_true>,_true> *)in_RDI;
}

Assistant:

vector<vector<char>> DialectCandidates::GetDefaultQuote() {
	return {{'\0'}, {'\"', '\''}, {'\"'}};
}